

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mock_code_generator.cc
# Opt level: O0

string * __thiscall
google::protobuf::compiler::MockCodeGenerator::GetOutputFileContent_abi_cxx11_
          (string *__return_storage_ptr__,MockCodeGenerator *this,string_view generator_name,
          string_view parameter,string_view file,string_view parsed_file_list,
          string_view first_message_name)

{
  string_view value;
  string_view value_00;
  string_view format;
  Arg *a4;
  Arg local_170;
  size_t local_140;
  char *local_138;
  Arg local_130;
  size_t local_100;
  char *local_f8;
  Arg local_f0;
  char *local_c0;
  size_t local_b8;
  Arg local_b0;
  char *local_80;
  char *local_78;
  Arg local_70;
  basic_string_view<char,_std::char_traits<char>_> local_40;
  char *local_30;
  string_view parameter_local;
  string_view generator_name_local;
  
  parameter_local._M_len = parameter._M_len;
  local_30 = generator_name._M_str;
  a4 = (Arg *)&file;
  parameter_local._M_str = (char *)this;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_40,"$0: $1, $2, $3, $4\n");
  local_80 = parameter_local._M_str;
  value_00._M_str = (char *)generator_name._M_len;
  value_00._M_len = (size_t)parameter_local._M_str;
  local_78 = (char *)generator_name._M_len;
  absl::lts_20250127::substitute_internal::Arg::Arg(&local_70,value_00);
  local_c0 = local_30;
  local_b8 = parameter_local._M_len;
  value._M_str = (char *)parameter_local._M_len;
  value._M_len = (size_t)local_30;
  absl::lts_20250127::substitute_internal::Arg::Arg(&local_b0,value);
  local_100 = (a4->piece_)._M_len;
  local_f8 = (a4->piece_)._M_str;
  absl::lts_20250127::substitute_internal::Arg::Arg(&local_f0,a4->piece_);
  local_140 = first_message_name._M_len;
  local_138 = first_message_name._M_str;
  absl::lts_20250127::substitute_internal::Arg::Arg(&local_130,first_message_name);
  absl::lts_20250127::substitute_internal::Arg::Arg(&local_170,parsed_file_list);
  format._M_str = (char *)&local_70;
  format._M_len = (size_t)local_40._M_str;
  absl::lts_20250127::Substitute_abi_cxx11_
            (__return_storage_ptr__,(lts_20250127 *)local_40._M_len,format,&local_b0,&local_f0,
             &local_130,&local_170,a4);
  return __return_storage_ptr__;
}

Assistant:

std::string MockCodeGenerator::GetOutputFileContent(
    absl::string_view generator_name, absl::string_view parameter,
    absl::string_view file, absl::string_view parsed_file_list,
    absl::string_view first_message_name) {
  return absl::Substitute("$0: $1, $2, $3, $4\n", generator_name, parameter,
                          file, first_message_name, parsed_file_list);
}